

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetBestF0Contour
               (int f0_length,double **f0_candidates,double **f0_scores,int number_of_bands,
               double *best_f0_contour)

{
  int j;
  int i;
  double tmp;
  double *best_f0_contour_local;
  int number_of_bands_local;
  double **f0_scores_local;
  double **f0_candidates_local;
  int f0_length_local;
  
  for (i = 0; i < f0_length; i = i + 1) {
    tmp = (*f0_scores)[i];
    best_f0_contour[i] = (*f0_candidates)[i];
    for (j = 1; j < number_of_bands; j = j + 1) {
      if (f0_scores[j][i] <= tmp && tmp != f0_scores[j][i]) {
        tmp = f0_scores[j][i];
        best_f0_contour[i] = f0_candidates[j][i];
      }
    }
  }
  return;
}

Assistant:

static void GetBestF0Contour(int f0_length,
    const double * const * f0_candidates, const double * const * f0_scores,
    int number_of_bands, double *best_f0_contour) {
  double tmp;
  for (int i = 0; i < f0_length; ++i) {
    tmp = f0_scores[0][i];
    best_f0_contour[i] = f0_candidates[0][i];
    for (int j = 1; j < number_of_bands; ++j) {
      if (tmp > f0_scores[j][i]) {
        tmp = f0_scores[j][i];
        best_f0_contour[i] = f0_candidates[j][i];
      }
    }
  }
}